

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O1

int jpc_mqenc_flush(jpc_mqenc_t *mqenc,int termmode)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  sbyte sVar9;
  uint_fast32_t uVar10;
  uint_fast32_t uVar11;
  jas_stream_t *pjVar12;
  long lVar13;
  
  if (termmode == 0) {
    uVar7 = mqenc->creg | 0xffff;
    uVar8 = uVar7 - 0x8000;
    if (uVar7 < mqenc->areg + mqenc->creg) {
      uVar8 = uVar7;
    }
    uVar10 = uVar8 << ((byte)mqenc->ctreg & 0x3f);
    mqenc->creg = uVar10;
    lVar13 = mqenc->outbuf;
    if (lVar13 == 0xff) {
LAB_00123a59:
      pjVar12 = mqenc->out;
      if ((pjVar12->flags_ & 7U) == 0) {
        if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
          pjVar12->flags_ = pjVar12->flags_ | 4;
          goto LAB_00123a68;
        }
        *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
        iVar5 = pjVar12->cnt_;
        pjVar12->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          iVar5 = jas_stream_flushbuf(pjVar12,0xff);
          if (iVar5 == -1) goto LAB_00123a68;
        }
        else {
          pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
          puVar3 = pjVar12->ptr_;
          pjVar12->ptr_ = puVar3 + 1;
          *puVar3 = 0xff;
        }
      }
      else {
LAB_00123a68:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar10 = 7;
      uVar6 = 0xfffff;
      sVar9 = 0x14;
    }
    else {
      uVar6 = (uint)uVar10;
      if ((uVar6 >> 0x1b & 1) == 0) {
        uVar10 = 8;
        uVar6 = 0x7ffff;
        sVar9 = 0x13;
        if (lVar13 < 0) goto LAB_00123cb4;
        pjVar12 = mqenc->out;
        if ((pjVar12->flags_ & 7U) == 0) {
          if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
            *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
            iVar5 = pjVar12->cnt_;
            pjVar12->cnt_ = iVar5 + -1;
            if (iVar5 < 1) {
              uVar4 = (uint)lVar13;
LAB_00123ca6:
              sVar9 = 0x13;
              uVar10 = 8;
              uVar6 = 0x7ffff;
              iVar5 = jas_stream_flushbuf(pjVar12,uVar4 & 0xff);
              if (iVar5 == -1) goto LAB_00123cb0;
            }
            else {
              pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
              puVar3 = pjVar12->ptr_;
              pjVar12->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)lVar13;
            }
            goto LAB_00123cb4;
          }
          pjVar12->flags_ = pjVar12->flags_ | 4;
        }
        goto LAB_00123cb0;
      }
      lVar2 = lVar13 + 1;
      mqenc->outbuf = lVar2;
      if (lVar2 == 0xff) {
        mqenc->creg = (ulong)(uVar6 & 0x7ffffff);
        goto LAB_00123a59;
      }
      uVar10 = 8;
      uVar6 = 0x7ffff;
      sVar9 = 0x13;
      if (-2 < lVar13) {
        pjVar12 = mqenc->out;
        if ((pjVar12->flags_ & 7U) == 0) {
          if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
            *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
            iVar5 = pjVar12->cnt_;
            pjVar12->cnt_ = iVar5 + -1;
            if (iVar5 < 1) {
              uVar4 = (uint)lVar2;
              goto LAB_00123ca6;
            }
            pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
            puVar3 = pjVar12->ptr_;
            pjVar12->ptr_ = puVar3 + 1;
            *puVar3 = (uchar)lVar2;
            goto LAB_00123cb4;
          }
          pjVar12->flags_ = pjVar12->flags_ | 4;
        }
LAB_00123cb0:
        sVar9 = 0x13;
        uVar10 = 8;
        uVar6 = 0x7ffff;
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
    }
LAB_00123cb4:
    mqenc->lastbyte = mqenc->outbuf;
    uVar7 = mqenc->creg >> sVar9;
    uVar8 = uVar7 & 0xff;
    uVar11 = (ulong)((uint)mqenc->creg & uVar6) << (sbyte)uVar10;
    mqenc->outbuf = uVar8;
    mqenc->ctreg = uVar10;
    mqenc->creg = uVar11;
    if (uVar8 == 0xff) {
LAB_00123cec:
      pjVar12 = mqenc->out;
      if ((pjVar12->flags_ & 7U) == 0) {
        if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
          pjVar12->flags_ = pjVar12->flags_ | 4;
          goto LAB_00123cfb;
        }
        *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
        iVar5 = pjVar12->cnt_;
        pjVar12->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          iVar5 = jas_stream_flushbuf(pjVar12,0xff);
          if (iVar5 == -1) goto LAB_00123cfb;
        }
        else {
          pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
          puVar3 = pjVar12->ptr_;
          pjVar12->ptr_ = puVar3 + 1;
          *puVar3 = 0xff;
        }
      }
      else {
LAB_00123cfb:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar10 = 7;
      uVar6 = 0xfffff;
      sVar9 = 0x14;
    }
    else {
      uVar6 = (uint)uVar11;
      if ((uVar6 >> 0x1b & 1) != 0) {
        lVar13 = uVar8 + 1;
        mqenc->outbuf = lVar13;
        if (lVar13 != 0xff) {
          pjVar12 = mqenc->out;
          if ((pjVar12->flags_ & 7U) == 0) {
            if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
              *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
              iVar5 = pjVar12->cnt_;
              pjVar12->cnt_ = iVar5 + -1;
              if (iVar5 < 1) {
                uVar6 = (uint)lVar13;
                goto LAB_00123e37;
              }
              pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
              puVar3 = pjVar12->ptr_;
              pjVar12->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)lVar13;
              goto LAB_00123e45;
            }
            pjVar12->flags_ = pjVar12->flags_ | 4;
          }
          goto LAB_00123e41;
        }
        mqenc->creg = (ulong)(uVar6 & 0x7fffffe);
        goto LAB_00123cec;
      }
      pjVar12 = mqenc->out;
      if ((pjVar12->flags_ & 7U) == 0) {
        if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
          pjVar12->flags_ = pjVar12->flags_ | 4;
          goto LAB_00123e41;
        }
        *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
        iVar5 = pjVar12->cnt_;
        pjVar12->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          uVar6 = (uint)uVar7;
LAB_00123e37:
          iVar5 = jas_stream_flushbuf(pjVar12,uVar6 & 0xff);
          if (iVar5 == -1) goto LAB_00123e41;
        }
        else {
          pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
          puVar3 = pjVar12->ptr_;
          pjVar12->ptr_ = puVar3 + 1;
          *puVar3 = (uchar)uVar7;
        }
      }
      else {
LAB_00123e41:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
LAB_00123e45:
      uVar10 = 8;
      uVar6 = 0x7ffff;
      sVar9 = 0x13;
    }
    mqenc->lastbyte = mqenc->outbuf;
    uVar7 = mqenc->creg >> sVar9;
    uVar8 = uVar7 & 0xff;
    mqenc->outbuf = uVar8;
    mqenc->creg = (ulong)((uint)mqenc->creg & uVar6);
    mqenc->ctreg = uVar10;
    if (uVar8 == 0xff) {
      return 0;
    }
    uVar6 = (uint)mqenc->creg;
    if ((uVar6 >> 0x1b & 1) != 0) {
      lVar13 = uVar8 + 1;
      mqenc->outbuf = lVar13;
      if (lVar13 != 0xff) goto LAB_00123f32;
      mqenc->creg = (ulong)(uVar6 & 0x7ffffff);
LAB_00123ef7:
      pjVar12 = mqenc->out;
      if ((pjVar12->flags_ & 7U) == 0) {
        if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
          *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
          iVar5 = pjVar12->cnt_;
          pjVar12->cnt_ = iVar5 + -1;
          if (0 < iVar5) {
            pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
            puVar3 = pjVar12->ptr_;
            pjVar12->ptr_ = puVar3 + 1;
            *puVar3 = 0xff;
            goto LAB_00123f06;
          }
          iVar5 = jas_stream_flushbuf(pjVar12,0xff);
          if (iVar5 != -1) goto LAB_00123f06;
        }
        else {
          pjVar12->flags_ = pjVar12->flags_ | 4;
        }
      }
      *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_00123f06:
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
      mqenc->creg = (ulong)((uint)mqenc->creg & 0xfffff);
      mqenc->ctreg = 7;
      return 0;
    }
    pjVar12 = mqenc->out;
    uVar6 = pjVar12->flags_;
    if ((uVar6 & 7) == 0) {
      if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
        *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
        iVar5 = pjVar12->cnt_;
        pjVar12->cnt_ = iVar5 + -1;
        if (0 < iVar5) {
          pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
          puVar3 = pjVar12->ptr_;
          pjVar12->ptr_ = puVar3 + 1;
          *puVar3 = (uchar)uVar7;
          goto LAB_00123fef;
        }
        uVar6 = (uint)uVar7 & 0xff;
        goto LAB_00123fe1;
      }
LAB_00123fad:
      pjVar12->flags_ = uVar6 | 4;
    }
  }
  else {
    if (termmode != 1) {
      abort();
    }
    for (lVar13 = 0xc - mqenc->ctreg; 0 < lVar13; lVar13 = lVar13 - uVar10) {
      uVar10 = mqenc->creg << ((byte)mqenc->ctreg & 0x3f);
      mqenc->creg = uVar10;
      mqenc->ctreg = 0;
      lVar2 = mqenc->outbuf;
      if (lVar2 == 0xff) {
LAB_0012385b:
        pjVar12 = mqenc->out;
        if ((pjVar12->flags_ & 7U) == 0) {
          if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
            pjVar12->flags_ = pjVar12->flags_ | 4;
            goto LAB_0012386a;
          }
          *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
          iVar5 = pjVar12->cnt_;
          pjVar12->cnt_ = iVar5 + -1;
          if (iVar5 < 1) {
            iVar5 = jas_stream_flushbuf(pjVar12,0xff);
            if (iVar5 == -1) goto LAB_0012386a;
          }
          else {
            pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
            puVar3 = pjVar12->ptr_;
            pjVar12->ptr_ = puVar3 + 1;
            *puVar3 = 0xff;
          }
        }
        else {
LAB_0012386a:
          *(byte *)&mqenc->err = (byte)mqenc->err | 1;
        }
        uVar10 = 7;
        uVar6 = 0xfffff;
        sVar9 = 0x14;
      }
      else {
        uVar6 = (uint)uVar10;
        if ((uVar6 >> 0x1b & 1) == 0) {
          uVar10 = 8;
          uVar6 = 0x7ffff;
          sVar9 = 0x13;
          if (lVar2 < 0) goto LAB_001239f4;
          pjVar12 = mqenc->out;
          if ((pjVar12->flags_ & 7U) == 0) {
            if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
              *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
              iVar5 = pjVar12->cnt_;
              pjVar12->cnt_ = iVar5 + -1;
              if (iVar5 < 1) {
                uVar4 = (uint)lVar2;
LAB_001239e6:
                sVar9 = 0x13;
                uVar6 = 0x7ffff;
                uVar10 = 8;
                iVar5 = jas_stream_flushbuf(pjVar12,uVar4 & 0xff);
                if (iVar5 == -1) goto LAB_001239f0;
              }
              else {
                pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
                puVar3 = pjVar12->ptr_;
                pjVar12->ptr_ = puVar3 + 1;
                *puVar3 = (uchar)lVar2;
              }
              goto LAB_001239f4;
            }
            pjVar12->flags_ = pjVar12->flags_ | 4;
          }
          goto LAB_001239f0;
        }
        lVar1 = lVar2 + 1;
        mqenc->outbuf = lVar1;
        if (lVar1 == 0xff) {
          mqenc->creg = (ulong)(uVar6 & 0x7ffffff);
          goto LAB_0012385b;
        }
        uVar10 = 8;
        uVar6 = 0x7ffff;
        sVar9 = 0x13;
        if (-2 < lVar2) {
          pjVar12 = mqenc->out;
          if ((pjVar12->flags_ & 7U) == 0) {
            if ((pjVar12->rwlimit_ < 0) || (pjVar12->rwcnt_ < pjVar12->rwlimit_)) {
              *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
              iVar5 = pjVar12->cnt_;
              pjVar12->cnt_ = iVar5 + -1;
              if (iVar5 < 1) {
                uVar4 = (uint)lVar1;
                goto LAB_001239e6;
              }
              pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
              puVar3 = pjVar12->ptr_;
              pjVar12->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)lVar1;
              goto LAB_001239f4;
            }
            pjVar12->flags_ = pjVar12->flags_ | 4;
          }
LAB_001239f0:
          sVar9 = 0x13;
          uVar6 = 0x7ffff;
          uVar10 = 8;
          *(byte *)&mqenc->err = (byte)mqenc->err | 1;
        }
      }
LAB_001239f4:
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> sVar9 & 0xff;
      mqenc->creg = (ulong)((uint)mqenc->creg & uVar6);
      mqenc->ctreg = uVar10;
    }
    lVar2 = mqenc->outbuf;
    if (lVar2 == 0xff) {
      return 0;
    }
    uVar6 = (uint)mqenc->creg;
    if ((uVar6 >> 0x1b & 1) == 0) {
      if (lVar2 < 0) goto LAB_00123fef;
      pjVar12 = mqenc->out;
      if ((pjVar12->flags_ & 7U) != 0) goto LAB_00123feb;
      if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) {
        pjVar12->flags_ = pjVar12->flags_ | 4;
        goto LAB_00123feb;
      }
      *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
      iVar5 = pjVar12->cnt_;
      pjVar12->cnt_ = iVar5 + -1;
      if (0 < iVar5) {
        pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
        puVar3 = pjVar12->ptr_;
        pjVar12->ptr_ = puVar3 + 1;
        *puVar3 = (uchar)lVar2;
        goto LAB_00123fef;
      }
      uVar6 = (uint)lVar2 & 0xff;
    }
    else {
      lVar13 = lVar2 + 1;
      mqenc->outbuf = lVar13;
      if (lVar13 == 0xff) {
        mqenc->creg = (ulong)(uVar6 & 0x7ffffff);
        goto LAB_00123ef7;
      }
      if (lVar2 < -1) goto LAB_00123fef;
LAB_00123f32:
      pjVar12 = mqenc->out;
      uVar6 = pjVar12->flags_;
      if ((uVar6 & 7) != 0) goto LAB_00123feb;
      if ((-1 < pjVar12->rwlimit_) && (pjVar12->rwlimit_ <= pjVar12->rwcnt_)) goto LAB_00123fad;
      *(byte *)&pjVar12->bufmode_ = (byte)pjVar12->bufmode_ | 0x20;
      iVar5 = pjVar12->cnt_;
      pjVar12->cnt_ = iVar5 + -1;
      if (0 < iVar5) {
        pjVar12->rwcnt_ = pjVar12->rwcnt_ + 1;
        puVar3 = pjVar12->ptr_;
        pjVar12->ptr_ = puVar3 + 1;
        *puVar3 = (uchar)lVar13;
        goto LAB_00123fef;
      }
      uVar6 = (uint)lVar13 & 0xff;
    }
LAB_00123fe1:
    iVar5 = jas_stream_flushbuf(pjVar12,uVar6);
    if (iVar5 != -1) goto LAB_00123fef;
  }
LAB_00123feb:
  *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_00123fef:
  mqenc->lastbyte = mqenc->outbuf;
  mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
  mqenc->creg = (ulong)((uint)mqenc->creg & 0x7ffff);
  mqenc->ctreg = 8;
  return 0;
}

Assistant:

int jpc_mqenc_flush(jpc_mqenc_t *mqenc, int termmode)
{
	int_fast16_t k;

	switch (termmode) {
	case JPC_MQENC_PTERM:
		k = 11 - mqenc->ctreg + 1;
		while (k > 0) {
			mqenc->creg <<= mqenc->ctreg;
			mqenc->ctreg = 0;
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg,
			  mqenc);
			k -= mqenc->ctreg;
		}
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	case JPC_MQENC_DEFTERM:
		jpc_mqenc_setbits(mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	default:
		abort();
		break;
	}
	return 0;
}